

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.cpp:214:57)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_function_object_cpp:214:57)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  undefined8 uVar1;
  value *pvVar2;
  bool bVar3;
  uint32_t uVar4;
  void *pvVar5;
  long *plVar6;
  void *pvVar7;
  global_object *pgVar8;
  undefined8 *puVar9;
  function_object *this_00;
  native_error_exception *this_01;
  uint32_t index;
  pointer pvVar10;
  long lVar11;
  ulong uVar12;
  anon_class_16_1_570cf4e1_for_f *this_02;
  object_ptr a;
  object_ptr p;
  vector<mjs::value,_std::allocator<mjs::value>_> new_args;
  gc_heap_ptr<mjs::function_object> f;
  wostringstream woss;
  wstring_view local_268;
  undefined1 local_258 [16];
  wstring local_248;
  value local_228;
  vector<mjs::value,_std::allocator<mjs::value>_> *local_200;
  gc_heap_ptr_untyped local_1f8;
  vector<mjs::value,_std::allocator<mjs::value>_> local_1e8;
  value *local_1d0;
  gc_heap_ptr_untyped local_1c8;
  gc_heap *local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *local_1b0;
  wostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d0 = __return_storage_ptr__;
  anon_unknown_65::get_function_object_ptr((anon_unknown_65 *)&local_1c8,this_);
  local_1e8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar10 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_200 = args;
  if (((ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pvVar10 >> 3) * -0x3333333333333333)
       < 2) || (pvVar10[1].type_ < boolean)) goto LAB_00138acc;
  std::__cxx11::wostringstream::wostringstream(local_1a8);
  this_02 = &this->f;
  pvVar10 = (local_200->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pvVar10[1].type_ != object) {
    debug_print((wostream *)local_1a8,pvVar10 + 1,4,0x7fffffff,0);
    goto LAB_00138b56;
  }
  local_268._M_len =
       (size_t)pvVar10[1].field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
               heap_;
  local_268._M_str =
       (wchar_t *)CONCAT44(local_268._M_str._4_4_,*(undefined4 *)((long)&pvVar10[1].field_1 + 8));
  if ((gc_heap *)local_268._M_len != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_268._M_len,(gc_heap_ptr_untyped *)&local_268);
  }
  pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_268);
  if (*(int *)((long)pvVar5 + 0x14) == 0) {
    local_258._0_8_ = (gc_heap *)0x0;
    local_258._8_8_ = local_258._8_8_ & 0xffffffff00000000;
  }
  else {
    gc_heap::unsafe_create_from_position<mjs::object>
              ((gc_heap *)local_258,(uint32_t)*(undefined8 *)((long)pvVar5 + 8));
  }
  pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_02);
  uVar1 = local_258._0_8_;
  if (*(int *)((long)pvVar5 + 0x20) < 2) {
    if ((gc_heap *)local_258._0_8_ != (gc_heap *)0x0) {
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_258);
      plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_02);
      (**(code **)(*plVar6 + 0x70))(&local_1f8,plVar6);
      pvVar7 = gc_heap_ptr_untyped::get(&local_1f8);
      if (pvVar5 == pvVar7) {
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1f8);
        goto LAB_0013899c;
      }
    }
    pgVar8 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_02);
    bVar3 = global_object::is_arguments_array(pgVar8,(object_ptr *)&local_268);
    if ((gc_heap *)uVar1 != (gc_heap *)0x0) {
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1f8);
    }
    if (!bVar3) {
      gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_268);
      object::class_name((object *)&local_228);
      mjs::operator<<((wostream *)local_1a8,(string *)&local_228);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_228);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_258);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_268);
LAB_00138b56:
      std::operator<<((wostream *)local_1a8," is not an (arguments) array");
      this_01 = (native_error_exception *)__cxa_allocate_exception(0x58);
      pgVar8 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_02);
      global_object::stack_trace_abi_cxx11_((wstring *)&local_228,pgVar8);
      local_268._M_len = (size_t)local_228.field_1.n_;
      local_268._M_str = (wchar_t *)local_228._0_8_;
      std::__cxx11::wstringbuf::str();
      local_258._0_8_ = local_248._M_string_length;
      local_258._8_8_ = local_248._M_dataplus._M_p;
      native_error_exception::native_error_exception
                (this_01,type,&local_268,(wstring_view *)local_258);
      __cxa_throw(this_01,&native_error_exception::typeinfo,
                  native_error_exception::~native_error_exception);
    }
  }
LAB_0013899c:
  puVar9 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_268);
  local_248._M_dataplus._M_p = (pointer)0x6;
  local_248._M_string_length = 0x199948;
  (**(code **)*puVar9)(&local_228,puVar9);
  uVar4 = to_uint32(&local_228);
  value::destroy(&local_228);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::resize(&local_1e8,(ulong)uVar4);
  if (uVar4 != 0) {
    lVar11 = 0;
    uVar12 = 0;
    do {
      puVar9 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_268);
      index_string_abi_cxx11_(&local_248,(mjs *)(uVar12 & 0xffffffff),index);
      local_1b8 = (gc_heap *)local_248._M_string_length;
      local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)local_248._M_dataplus._M_p;
      (**(code **)*puVar9)(&local_228,puVar9,&local_1b8);
      value::operator=((value *)((long)&(local_1e8.
                                         super__Vector_base<mjs::value,_std::allocator<mjs::value>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->type_ + lVar11)
                       ,&local_228);
      value::destroy(&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity * 4 + 4);
      }
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x28;
    } while (uVar4 != uVar12);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_258);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_268);
  std::__cxx11::wostringstream::~wostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
LAB_00138acc:
  this_00 = (function_object *)gc_heap_ptr_untyped::get(&local_1c8);
  pvVar2 = local_1d0;
  pvVar10 = (local_200->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pvVar10 ==
      (local_200->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    pvVar10 = (pointer)&value::undefined;
  }
  function_object::call(local_1d0,this_00,pvVar10,&local_1e8);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_1e8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1c8);
  return pvVar2;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }